

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O1

vector<merlin::factor,_std::allocator<merlin::factor>_> * __thiscall
merlin::graphical_model::assert_evidence
          (vector<merlin::factor,_std::allocator<merlin::factor>_> *__return_storage_ptr__,
          graphical_model *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *evidence,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *old_to_new)

{
  double dVar1;
  _func_int **pp_Var2;
  _Base_ptr v_state;
  pointer pdVar3;
  pointer puVar4;
  pointer pfVar5;
  bool bVar6;
  _Rb_tree_node_base *p_Var7;
  mapped_type *pmVar8;
  ostream *poVar9;
  runtime_error *this_00;
  factor *f_00;
  ulong uVar10;
  long lVar11;
  mapped_type mVar12;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *result;
  vector<merlin::factor,_std::allocator<merlin::factor>_> temp;
  variable_set non_evid_vars;
  factor f;
  vindex old_idx;
  stringstream ss;
  vector<merlin::factor,_std::allocator<merlin::factor>_> local_2e8;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_2c8;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_2c0;
  factor *local_2b8;
  factor *local_2b0;
  variable_set local_2a8;
  variable local_268;
  factor local_258;
  variable_set local_1f0;
  undefined1 local_1b8 [392];
  
  local_2a8.m_d = (vsize *)0x0;
  local_2a8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  f_00 = (this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
         _M_impl.super__Vector_impl_data._M_start;
  local_2c8 = evidence;
  local_2c0 = old_to_new;
  if (f_00 != (this->m_factors).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
    local_2b8 = &this->m_global_const;
    do {
      local_2b0 = f_00;
      factor::factor(&local_258,f_00);
      for (p_Var7 = (local_2c8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(evidence->_M_t)._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        pp_Var2 = *(_func_int ***)(p_Var7 + 1);
        v_state = p_Var7[1]._M_parent;
        pdVar3 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar1 = pdVar3[(long)pp_Var2];
        uVar10 = (ulong)dVar1;
        if ((_Base_ptr)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10) <=
            v_state) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"Evidence value ",0xf);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," is outside variable\'s x",0x18);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," domain.",8);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(this_00,(string *)&local_1f0);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        dVar1 = pdVar3[(long)pp_Var2];
        uVar10 = (ulong)dVar1;
        local_1b8._8_8_ = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
        local_1b8._0_8_ = pp_Var2;
        bVar6 = variable_set::contains(&local_258.v_,(variable *)local_1b8);
        if (bVar6) {
          dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pp_Var2];
          local_268.m_states = (size_t)dVar1;
          local_268.m_states =
               (long)(dVar1 - 9.223372036854776e+18) & (long)local_268.m_states >> 0x3f |
               local_268.m_states;
          local_268.m_label = (size_t)pp_Var2;
          variable_set::variable_set(&local_1f0,&local_268);
          factor::condition((factor *)local_1b8,&local_258,&local_1f0,(vsize)v_state);
          factor::operator=(&local_258,(factor *)local_1b8);
          factor::~factor((factor *)local_1b8);
          variable_set::~variable_set(&local_1f0);
        }
      }
      if ((long)local_258.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_258.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start == 8) {
        factor::binaryOpIP<merlin::factor::binOpTimes>(local_2b8,&local_258);
      }
      else {
        std::vector<merlin::factor,_std::allocator<merlin::factor>_>::push_back
                  (&local_2e8,&local_258);
        variable_set::operator|=(&local_2a8,&local_258.v_);
      }
      factor::~factor(&local_258);
      f_00 = local_2b0 + 1;
    } while (f_00 != (this->m_factors).
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  if (local_2a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_2a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    mVar12 = 0;
    do {
      local_1b8._0_8_ =
           local_2a8.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[mVar12];
      pmVar8 = std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[](local_2c0,(key_type *)local_1b8);
      *pmVar8 = mVar12;
      mVar12 = mVar12 + 1;
    } while (mVar12 != (long)local_2a8.m_v.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2a8.m_v.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
  }
  (__return_storage_ptr__->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_2e8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_2e8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      pfVar5 = local_2e8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_258.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_258._vptr_factor = (_func_int **)0x0;
      local_258.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_2e8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].v_.m_v.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_2e8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].v_.m_v.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar11 = 0;
        do {
          local_1f0.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)pfVar5[uVar10].v_.m_v.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11];
          puVar4 = (pointer)pfVar5[uVar10].v_.m_d[lVar11];
          pmVar8 = std::
                   map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::operator[](local_2c0,(key_type *)&local_1f0);
          local_1b8._0_8_ = *pmVar8;
          local_1b8._8_8_ = puVar4;
          variable_set::operator|=((variable_set *)&local_258,(variable *)local_1b8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != (long)pfVar5[uVar10].v_.m_v.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)pfVar5[uVar10].v_.m_v.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3);
      }
      factor::factor((factor *)local_1b8,(variable_set *)&local_258,
                     pfVar5[uVar10].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::emplace_back<merlin::factor>
                (__return_storage_ptr__,(factor *)local_1b8);
      factor::~factor((factor *)local_1b8);
      variable_set::~variable_set((variable_set *)&local_258);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)(((long)local_2e8.
                                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2e8.
                                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             -0x5555555555555555));
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&local_2e8);
  variable_set::~variable_set(&local_2a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<factor> assert_evidence(const std::map<size_t, size_t>& evidence,
			std::map<size_t, size_t>& old_to_new) {

		// Condition the factors on the evidence, and accumulate the constant
		variable_set non_evid_vars;
		std::vector<factor> temp;
		std::vector<factor>::const_iterator it = m_factors.begin();
		for (; it != m_factors.end(); ++it) {
			factor f = (*it);
			for (std::map<size_t, size_t>::const_iterator mi = evidence.begin();
					mi != evidence.end(); ++mi) {
				size_t v = mi->first;
				size_t k = mi->second;

				// check if value is in domain
				if (k >= var(v).states()) {
					std::stringstream ss;
					ss << "Evidence value " << k << " is outside variable's x"
						<< v << " domain.";
					throw std::runtime_error(ss.str());
				}

				if (f.vars().contains(var(v))) {
					f = f.condition(var(v), k);
				}
			}

			if (f.isscalar()) {
				m_global_const *= f; // accumulate the global constant
			} else {
				temp.push_back(f);
				non_evid_vars |= f.vars();
			}
		}

		// Re-index the non-evidence variables
		vindex idx = 0;
		for (variable_set::const_iterator ci = non_evid_vars.begin();
				ci != non_evid_vars.end(); ++ci) {
			old_to_new[ci->label()] = idx;
			++idx;
		}

		std::vector<factor> result;
		for (size_t i = 0; i < temp.size(); ++i) {
			const factor& f = temp[i];
			variable_set vs;
			for (variable_set::const_iterator ci = f.vars().begin();
					ci != f.vars().end(); ++ci) {
				vindex old_idx = ci->label();
				size_t dim = ci->states();
				vindex new_idx = old_to_new[old_idx];
				vs |= variable(new_idx, dim);
			}

			result.push_back(factor(vs, (double*)f.table()));
		}

		return result;
	}